

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DTDElementDecl::addAttDef(DTDElementDecl *this,DTDAttDef *toAdd)

{
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *this_00;
  XMLSize_t XVar1;
  MemoryManager *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  DTDAttDefList *pDVar4;
  undefined4 extraout_var_00;
  
  if (this->fAttDefs == (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0) {
    faultInAttDefList(this);
  }
  toAdd->fElemId = (this->super_XMLElementDecl).fId;
  this_00 = this->fAttDefs;
  iVar3 = (*(toAdd->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(toAdd);
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::put
            (this_00,(void *)CONCAT44(extraout_var,iVar3),toAdd);
  if (this->fAttList == (DTDAttDefList *)0x0) {
    pDVar4 = (DTDAttDefList *)
             XMemory::operator_new(0x38,(this->super_XMLElementDecl).fMemoryManager);
    DTDAttDefList::DTDAttDefList(pDVar4,this->fAttDefs,(this->super_XMLElementDecl).fMemoryManager);
    this->fAttList = pDVar4;
  }
  pDVar4 = this->fAttList;
  XVar1 = pDVar4->fSize;
  if (pDVar4->fCount == XVar1) {
    pDVar4->fSize = XVar1 * 2;
    pMVar2 = (pDVar4->super_XMLAttDefList).fMemoryManager;
    iVar3 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,XVar1 << 4);
    memcpy((DTDAttDef **)CONCAT44(extraout_var_00,iVar3),pDVar4->fArray,pDVar4->fCount << 3);
    pMVar2 = (pDVar4->super_XMLAttDefList).fMemoryManager;
    (*pMVar2->_vptr_MemoryManager[4])(pMVar2,pDVar4->fArray);
    pDVar4->fArray = (DTDAttDef **)CONCAT44(extraout_var_00,iVar3);
  }
  XVar1 = pDVar4->fCount;
  pDVar4->fCount = XVar1 + 1;
  pDVar4->fArray[XVar1] = toAdd;
  return;
}

Assistant:

void DTDElementDecl::addAttDef(DTDAttDef* const toAdd)
{
    // Fault in the att list if required
    if (!fAttDefs)
            faultInAttDefList();

    // Tell this guy the element id of its parent (us)
    toAdd->setElemId(getId());

    fAttDefs->put((void*)(toAdd->getFullName()), toAdd);
    // update and/or create fAttList
    if(!fAttList)
        ((DTDElementDecl*)this)->fAttList = new (getMemoryManager()) DTDAttDefList(fAttDefs,getMemoryManager());
    fAttList->addAttDef(toAdd);
}